

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-rand.c
# Opt level: O0

int damroll(int num,int sides)

{
  uint32_t uVar1;
  undefined4 local_1c;
  undefined4 local_18;
  int sum;
  int i;
  int sides_local;
  int num_local;
  
  local_1c = 0;
  if (sides < 1) {
    sides_local = 0;
  }
  else {
    for (local_18 = 0; local_18 < num; local_18 = local_18 + 1) {
      uVar1 = Rand_div(sides);
      local_1c = uVar1 + 1 + local_1c;
    }
    sides_local = local_1c;
  }
  return sides_local;
}

Assistant:

int damroll(int num, int sides)
{
	int i;
	int sum = 0;

	if (sides <= 0) return 0;

	for (i = 0; i < num; i++)
		sum += randint1(sides);
	return sum;
}